

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# processes.cxx
# Opt level: O0

void __thiscall
Regular::Regular(Regular *this,double rate,double shift,Time *time,string *name,string *type)

{
  allocator<char> local_71;
  string local_70;
  long local_40;
  long longShift;
  string *type_local;
  string *name_local;
  Time *time_local;
  double shift_local;
  double rate_local;
  Regular *this_local;
  
  longShift = (long)type;
  type_local = name;
  name_local = (string *)time;
  time_local = (Time *)shift;
  shift_local = rate;
  rate_local = (double)this;
  StochasticEventGenerator::StochasticEventGenerator
            (&this->super_StochasticEventGenerator,time,name,type);
  (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
  super_Parametric._vptr_Parametric = (_func_int **)&PTR__Regular_00190a80;
  (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
  super_TimeDependent._vptr_TimeDependent = (_func_int **)&PTR__Regular_00190b18;
  (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
  super_Physical._vptr_Physical = (_func_int **)&PTR__Regular_00190b60;
  this->regularInterval =
       (long)((1.0 / shift_local) /
             ((this->super_StochasticEventGenerator).super_StochasticVariable.
              super_StochasticProcess.super_TimeDependent.xTime)->dt);
  local_40 = (long)((double)time_local /
                   ((this->super_StochasticEventGenerator).super_StochasticVariable.
                    super_StochasticProcess.super_TimeDependent.xTime)->dt);
  if (local_40 < 2) {
    this->regularCount = this->regularInterval + local_40;
  }
  else {
    this->regularCount = local_40 + -1;
  }
  std::__cxx11::string::operator=
            ((string *)
             &(this->super_StochasticEventGenerator).super_StochasticVariable.
              super_StochasticProcess.stochDescription,"regular counting process");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"rate",&local_71);
  Parametric::addParameter((Parametric *)this,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  return;
}

Assistant:

Regular::Regular(double rate, double shift, Time *time, const string& name, const string& type)
: StochasticEventGenerator(time, name, type)
{
	regularInterval = long(1.0 / rate / xTime->dt);
	long longShift = long(shift / xTime->dt);
	if (longShift>1)
		regularCount = longShift - 1;
	else
		regularCount = regularInterval + longShift;
	stochDescription = "regular counting process";
	addParameter("rate");
}